

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urandom.cc
# Opt level: O1

int CRYPTO_sysrand_if_available(uint8_t *out,size_t requested)

{
  int iVar1;
  int *piVar2;
  undefined8 extraout_RAX;
  long lVar3;
  int in_ECX;
  uint extraout_EDX;
  int iVar4;
  size_t sVar5;
  uint8_t *puVar6;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 uVar7;
  
  sVar5 = requested;
  puVar6 = out;
  iVar1 = fill_with_entropy(out,requested,0,in_ECX);
  iVar4 = 1;
  if (iVar1 == 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      CRYPTO_sysrand_if_available_cold_1();
      uVar7 = extraout_RAX;
      do {
        lVar3 = syscall(0x13e,puVar6,sVar5,(ulong)extraout_EDX,in_R8,in_R9,uVar7,requested);
        if (lVar3 != -1) break;
        piVar2 = __errno_location();
      } while (*piVar2 == 4);
      return (int)lVar3;
    }
    iVar4 = 0;
    if (requested != 0) {
      memset(out,0,requested);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int CRYPTO_sysrand_if_available(uint8_t *out, size_t requested) {
  if (fill_with_entropy(out, requested, /*block=*/0, /*seed=*/0)) {
    return 1;
  } else if (errno == EAGAIN) {
    OPENSSL_memset(out, 0, requested);
    return 0;
  } else {
    perror("opportunistic entropy fill failed");
    abort();
  }
}